

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O3

Mvc_Cover_t * Mvc_CoverTranspose(Mvc_Cover_t *pCover)

{
  int *piVar1;
  Mvc_Manager_t *pMem;
  int nBits;
  Mvc_Cover_t *pCover_00;
  Mvc_Cube_t *pMVar2;
  Mvc_Cube_t *pMVar3;
  uint uVar4;
  uint uVar5;
  Mvc_List_t *pList;
  
  pMem = pCover->pMem;
  nBits = Mvc_CoverReadCubeNum(pCover);
  pCover_00 = Mvc_CoverAlloc(pMem,nBits);
  if (0 < pCover->nBits) {
    uVar5 = 0;
    do {
      pMVar2 = Mvc_CubeAlloc(pCover_00);
      uVar4 = *(uint *)&pMVar2->field_0x8 & 0xffffff;
      if (uVar4 == 0) {
        pMVar2->pData[0] = 0;
      }
      else if (uVar4 == 1) {
        *(undefined8 *)pMVar2->pData = 0;
      }
      else {
        memset(pMVar2->pData,0,(ulong)(*(uint *)&pMVar2->field_0x8 & 0xffffff) * 4 + 4);
      }
      pMVar3 = (pCover->lCubes).pHead;
      if (pMVar3 != (Mvc_Cube_t *)0x0) {
        uVar4 = 0;
        do {
          if ((pMVar3->pData[uVar5 >> 5] & 1 << ((byte)uVar5 & 0x1f)) != 0) {
            pMVar2->pData[uVar4 >> 5] = pMVar2->pData[uVar4 >> 5] | 1 << ((byte)uVar4 & 0x1f);
          }
          uVar4 = uVar4 + 1;
          pMVar3 = pMVar3->pNext;
        } while (pMVar3 != (Mvc_Cube_t *)0x0);
      }
      pMVar3 = (Mvc_Cube_t *)&pCover_00->lCubes;
      if ((pCover_00->lCubes).pHead != (Mvc_Cube_t *)0x0) {
        pMVar3 = (pCover_00->lCubes).pTail;
      }
      pMVar3->pNext = pMVar2;
      (pCover_00->lCubes).pTail = pMVar2;
      pMVar2->pNext = (Mvc_Cube_t *)0x0;
      piVar1 = &(pCover_00->lCubes).nItems;
      *piVar1 = *piVar1 + 1;
      uVar5 = uVar5 + 1;
    } while ((int)uVar5 < pCover->nBits);
  }
  return pCover_00;
}

Assistant:

Mvc_Cover_t * Mvc_CoverTranspose( Mvc_Cover_t * pCover )
{
    Mvc_Cover_t * pRes;
    Mvc_Cube_t * pCubeRes, * pCube;
    int nWord, nBit, i, iCube;

    pRes = Mvc_CoverAlloc( pCover->pMem, Mvc_CoverReadCubeNum(pCover) );
    for ( i = 0; i < pCover->nBits; i++ )
    {
        // get the word and bit of this literal
        nWord = Mvc_CubeWhichWord(i);
        nBit  = Mvc_CubeWhichBit(i);
        // get the transposed cube
        pCubeRes = Mvc_CubeAlloc( pRes );
        Mvc_CubeBitClean( pCubeRes );
        iCube = 0;
        Mvc_CoverForEachCube( pCover, pCube )
        {
            if ( pCube->pData[nWord] & (1<<nBit) )
                Mvc_CubeBitInsert( pCubeRes, iCube );
            iCube++;
        }
        Mvc_CoverAddCubeTail( pRes, pCubeRes ); 
    }
    return pRes;
}